

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpacking.cpp
# Opt level: O0

uint32_t * unpack32_32(uint32_t base,uint32_t *in,uint32_t *out)

{
  uint32_t *puVar1;
  uint32_t *out_local;
  uint32_t *in_local;
  uint32_t base_local;
  
  *out = *in;
  *out = base + *out;
  puVar1 = out + 1;
  *puVar1 = in[1];
  *puVar1 = base + *puVar1;
  puVar1 = out + 2;
  *puVar1 = in[2];
  *puVar1 = base + *puVar1;
  puVar1 = out + 3;
  *puVar1 = in[3];
  *puVar1 = base + *puVar1;
  puVar1 = out + 4;
  *puVar1 = in[4];
  *puVar1 = base + *puVar1;
  puVar1 = out + 5;
  *puVar1 = in[5];
  *puVar1 = base + *puVar1;
  puVar1 = out + 6;
  *puVar1 = in[6];
  *puVar1 = base + *puVar1;
  puVar1 = out + 7;
  *puVar1 = in[7];
  *puVar1 = base + *puVar1;
  puVar1 = out + 8;
  *puVar1 = in[8];
  *puVar1 = base + *puVar1;
  puVar1 = out + 9;
  *puVar1 = in[9];
  *puVar1 = base + *puVar1;
  puVar1 = out + 10;
  *puVar1 = in[10];
  *puVar1 = base + *puVar1;
  puVar1 = out + 0xb;
  *puVar1 = in[0xb];
  *puVar1 = base + *puVar1;
  puVar1 = out + 0xc;
  *puVar1 = in[0xc];
  *puVar1 = base + *puVar1;
  puVar1 = out + 0xd;
  *puVar1 = in[0xd];
  *puVar1 = base + *puVar1;
  puVar1 = out + 0xe;
  *puVar1 = in[0xe];
  *puVar1 = base + *puVar1;
  puVar1 = out + 0xf;
  *puVar1 = in[0xf];
  *puVar1 = base + *puVar1;
  puVar1 = out + 0x10;
  *puVar1 = in[0x10];
  *puVar1 = base + *puVar1;
  puVar1 = out + 0x11;
  *puVar1 = in[0x11];
  *puVar1 = base + *puVar1;
  puVar1 = out + 0x12;
  *puVar1 = in[0x12];
  *puVar1 = base + *puVar1;
  puVar1 = out + 0x13;
  *puVar1 = in[0x13];
  *puVar1 = base + *puVar1;
  puVar1 = out + 0x14;
  *puVar1 = in[0x14];
  *puVar1 = base + *puVar1;
  puVar1 = out + 0x15;
  *puVar1 = in[0x15];
  *puVar1 = base + *puVar1;
  puVar1 = out + 0x16;
  *puVar1 = in[0x16];
  *puVar1 = base + *puVar1;
  puVar1 = out + 0x17;
  *puVar1 = in[0x17];
  *puVar1 = base + *puVar1;
  puVar1 = out + 0x18;
  *puVar1 = in[0x18];
  *puVar1 = base + *puVar1;
  puVar1 = out + 0x19;
  *puVar1 = in[0x19];
  *puVar1 = base + *puVar1;
  puVar1 = out + 0x1a;
  *puVar1 = in[0x1a];
  *puVar1 = base + *puVar1;
  puVar1 = out + 0x1b;
  *puVar1 = in[0x1b];
  *puVar1 = base + *puVar1;
  puVar1 = out + 0x1c;
  *puVar1 = in[0x1c];
  *puVar1 = base + *puVar1;
  puVar1 = out + 0x1d;
  *puVar1 = in[0x1d];
  *puVar1 = base + *puVar1;
  puVar1 = out + 0x1e;
  *puVar1 = in[0x1e];
  *puVar1 = base + *puVar1;
  puVar1 = out + 0x1f;
  *puVar1 = in[0x1f];
  *puVar1 = base + *puVar1;
  return in + 0x20;
}

Assistant:

uint32_t * unpack32_32( uint32_t base,  uint32_t *   in, uint32_t *    out) {

    *out = ( (*in) >>  0  ) ;
    ++in;
    *out += base;
    out++;
    *out = ( (*in) >>  0  ) ;
    ++in;
    *out += base;
    out++;
    *out = ( (*in) >>  0  ) ;
    ++in;
    *out += base;
    out++;
    *out = ( (*in) >>  0  ) ;
    ++in;
    *out += base;
    out++;
    *out = ( (*in) >>  0  ) ;
    ++in;
    *out += base;
    out++;
    *out = ( (*in) >>  0  ) ;
    ++in;
    *out += base;
    out++;
    *out = ( (*in) >>  0  ) ;
    ++in;
    *out += base;
    out++;
    *out = ( (*in) >>  0  ) ;
    ++in;
    *out += base;
    out++;
    *out = ( (*in) >>  0  ) ;
    ++in;
    *out += base;
    out++;
    *out = ( (*in) >>  0  ) ;
    ++in;
    *out += base;
    out++;
    *out = ( (*in) >>  0  ) ;
    ++in;
    *out += base;
    out++;
    *out = ( (*in) >>  0  ) ;
    ++in;
    *out += base;
    out++;
    *out = ( (*in) >>  0  ) ;
    ++in;
    *out += base;
    out++;
    *out = ( (*in) >>  0  ) ;
    ++in;
    *out += base;
    out++;
    *out = ( (*in) >>  0  ) ;
    ++in;
    *out += base;
    out++;
    *out = ( (*in) >>  0  ) ;
    ++in;
    *out += base;
    out++;
    *out = ( (*in) >>  0  ) ;
    ++in;
    *out += base;
    out++;
    *out = ( (*in) >>  0  ) ;
    ++in;
    *out += base;
    out++;
    *out = ( (*in) >>  0  ) ;
    ++in;
    *out += base;
    out++;
    *out = ( (*in) >>  0  ) ;
    ++in;
    *out += base;
    out++;
    *out = ( (*in) >>  0  ) ;
    ++in;
    *out += base;
    out++;
    *out = ( (*in) >>  0  ) ;
    ++in;
    *out += base;
    out++;
    *out = ( (*in) >>  0  ) ;
    ++in;
    *out += base;
    out++;
    *out = ( (*in) >>  0  ) ;
    ++in;
    *out += base;
    out++;
    *out = ( (*in) >>  0  ) ;
    ++in;
    *out += base;
    out++;
    *out = ( (*in) >>  0  ) ;
    ++in;
    *out += base;
    out++;
    *out = ( (*in) >>  0  ) ;
    ++in;
    *out += base;
    out++;
    *out = ( (*in) >>  0  ) ;
    ++in;
    *out += base;
    out++;
    *out = ( (*in) >>  0  ) ;
    ++in;
    *out += base;
    out++;
    *out = ( (*in) >>  0  ) ;
    ++in;
    *out += base;
    out++;
    *out = ( (*in) >>  0  ) ;
    ++in;
    *out += base;
    out++;
    *out = ( (*in) >>  0  ) ;
    ++in;
    *out += base;
    out++;

    return in;
}